

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__write_req_finish(uv_write_t *req)

{
  uv_stream_t *puVar1;
  uv_stream_t *stream;
  uv_write_t *req_local;
  
  puVar1 = req->handle;
  *(void **)req->queue[1] = req->queue[0];
  *(void **)((long)req->queue[0] + 8) = req->queue[1];
  if (req->error == 0) {
    if (req->bufs != req->bufsml) {
      uv__free(req->bufs);
    }
    req->bufs = (uv_buf_t *)0x0;
  }
  req->queue[0] = puVar1->write_completed_queue;
  req->queue[1] = puVar1->write_completed_queue[1];
  *(void ***)req->queue[1] = req->queue;
  puVar1->write_completed_queue[1] = req->queue;
  uv__io_feed(puVar1->loop,&puVar1->io_watcher);
  return;
}

Assistant:

static void uv__write_req_finish(uv_write_t* req) {
  uv_stream_t* stream = req->handle;

  /* Pop the req off tcp->write_queue. */
  QUEUE_REMOVE(&req->queue);

  /* Only free when there was no error. On error, we touch up write_queue_size
   * right before making the callback. The reason we don't do that right away
   * is that a write_queue_size > 0 is our only way to signal to the user that
   * they should stop writing - which they should if we got an error. Something
   * to revisit in future revisions of the libuv API.
   */
  if (req->error == 0) {
    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;
  }

  /* Add it to the write_completed_queue where it will have its
   * callback called in the near future.
   */
  QUEUE_INSERT_TAIL(&stream->write_completed_queue, &req->queue);
  uv__io_feed(stream->loop, &stream->io_watcher);
}